

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O0

Abc_Des_t * Abc_DesDupBlackboxes(Abc_Des_t *p,Abc_Ntk_t *pNtkSave)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Abc_Des_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  int local_2c;
  int i;
  Abc_Ntk_t *pNtkTemp;
  Abc_Des_t *pNew;
  Abc_Ntk_t *pNtkSave_local;
  Abc_Des_t *p_local;
  
  iVar1 = Vec_PtrSize(p->vTops);
  if (iVar1 < 1) {
    __assert_fail("Vec_PtrSize(p->vTops) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLib.c"
                  ,0xaa,"Abc_Des_t *Abc_DesDupBlackboxes(Abc_Des_t *, Abc_Ntk_t *)");
  }
  iVar1 = Vec_PtrSize(p->vModules);
  if (iVar1 < 2) {
    __assert_fail("Vec_PtrSize(p->vModules) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLib.c"
                  ,0xab,"Abc_Des_t *Abc_DesDupBlackboxes(Abc_Des_t *, Abc_Ntk_t *)");
  }
  pAVar2 = Abc_DesCreate(p->pName);
  Vec_PtrPush(pAVar2->vTops,pNtkSave);
  Vec_PtrPush(pAVar2->vModules,pNtkSave);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vModules), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Abc_Ntk_t *)Vec_PtrEntry(p->vModules,local_2c);
    iVar1 = Abc_NtkHasBlackbox(pAVar3);
    if (iVar1 != 0) {
      p_00 = pAVar2->vModules;
      pAVar3 = Abc_NtkDup(pAVar3);
      Vec_PtrPush(p_00,pAVar3);
    }
  }
  return pAVar2;
}

Assistant:

Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave )
{
    Abc_Des_t * pNew;
    Abc_Ntk_t * pNtkTemp;
    int i;
    assert( Vec_PtrSize(p->vTops) > 0 );
    assert( Vec_PtrSize(p->vModules) > 1 );
    pNew = Abc_DesCreate( p->pName );
//    pNew->pManFunc = pNtkSave->pManFunc;
    Vec_PtrPush( pNew->vTops, pNtkSave );
    Vec_PtrPush( pNew->vModules, pNtkSave );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtkTemp, i )
        if ( Abc_NtkHasBlackbox( pNtkTemp ) )
            Vec_PtrPush( pNew->vModules, Abc_NtkDup(pNtkTemp) );
    return pNew;
}